

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O1

Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* anon_unknown.dwarf_846fc::Shader::create
            (Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,GLuint kind,string *src)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  GLuint GVar5;
  int iVar6;
  size_t sVar7;
  size_type sVar8;
  _Alloc_hider _Var9;
  uint uVar10;
  int line;
  string_view sv;
  string error_string;
  int pos;
  int mod;
  GLsizei length;
  GLint compiled;
  GLchar *c_src;
  char info [2048];
  int local_8b4;
  string local_8b0;
  string local_890;
  long *local_870;
  ulong local_868;
  long local_860 [2];
  undefined1 local_850 [4];
  undefined1 local_84c [4];
  undefined4 local_848;
  int local_844;
  pointer local_840;
  Shader local_838 [514];
  
  GVar5 = glCreateShader(kind);
  local_840 = (src->_M_dataplus)._M_p;
  glShaderSource(GVar5,1,&local_840,0);
  glCompileShader(GVar5);
  local_844 = 0;
  glGetShaderiv(GVar5,0x8b81,&local_844);
  if (local_844 == 1) {
    (__return_storage_ptr__->field_0).value_.name_ = GVar5;
    local_838[0].name_ = 0;
    __return_storage_ptr__->has_value_ = true;
    ~Shader(local_838);
  }
  else {
    local_848 = 0;
    glGetShaderInfoLog(GVar5,0x800,&local_848,local_838);
    glDeleteShader(GVar5);
    local_870 = local_860;
    sVar7 = strlen((char *)local_838);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_870,local_838,(long)&local_838[0].name_ + sVar7);
    iVar6 = __isoc99_sscanf(local_838,"%d:%d(%d)",local_84c,&local_8b4,local_850);
    if (iVar6 == 3) {
      local_890._M_string_length = (size_type)(src->_M_dataplus)._M_p;
      local_890._M_dataplus._M_p = (pointer)src->_M_string_length;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_890._M_dataplus._M_p !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) && (-2 < local_8b4)) {
        uVar10 = 1;
        do {
          sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_890,"\n",0,1
                            );
          _Var4._M_p = local_890._M_dataplus._M_p;
          if (local_8b4 + -3 <= (int)uVar10) {
            format_abi_cxx11_(&local_8b0,"\n%d: ",(ulong)uVar10);
            std::__cxx11::string::_M_append((char *)&local_870,(ulong)local_8b0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
              operator_delete(local_8b0._M_dataplus._M_p,local_8b0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::replace
                      ((ulong)&local_870,local_868,(char *)0x0,local_890._M_string_length);
          }
          _Var9._M_p = (pointer)(sVar8 + 1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(sVar8 + 1) ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            _Var9._M_p = _Var4._M_p;
          }
          local_890._M_string_length = local_890._M_string_length + (long)_Var9._M_p;
          local_890._M_dataplus._M_p = local_890._M_dataplus._M_p + -(long)_Var9._M_p;
        } while (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_890._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) && (bVar3 = (int)uVar10 < local_8b4 + 2, uVar10 = uVar10 + 1, bVar3));
      }
    }
    format_abi_cxx11_(&local_890,"Shader compilation error: %s",local_870);
    paVar2 = &local_8b0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_890._M_dataplus._M_p == &local_890.field_2) {
      local_8b0.field_2._8_8_ = local_890.field_2._8_8_;
      local_8b0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_8b0._M_dataplus._M_p = local_890._M_dataplus._M_p;
    }
    local_8b0.field_2._M_allocated_capacity._1_7_ = local_890.field_2._M_allocated_capacity._1_7_;
    local_8b0.field_2._M_local_buf[0] = local_890.field_2._M_local_buf[0];
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8b0._M_dataplus._M_p == paVar2) {
      paVar1->_M_allocated_capacity = local_8b0.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
           local_8b0.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = local_8b0._M_dataplus._M_p;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
           local_8b0.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_890._M_string_length;
    local_8b0.field_2._M_allocated_capacity =
         (ulong)(uint7)local_890.field_2._M_allocated_capacity._1_7_ << 8;
    __return_storage_ptr__->has_value_ = false;
    local_890.field_2._M_local_buf[0] = '\0';
    local_890._M_string_length = 0;
    local_8b0._M_string_length = 0;
    if (local_870 != local_860) {
      local_8b0._M_dataplus._M_p = (pointer)paVar2;
      local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
      operator_delete(local_870,local_860[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Expected<Shader,std::string> create(GLuint kind, const std::string& src) {
		GLuint name = glCreateShader(kind);
		GLchar const * const c_src = src.c_str();
		glShaderSource(name, 1, (const GLchar**)&c_src, nullptr);
		glCompileShader(name);

		GLint compiled = GL_FALSE;
		glGetShaderiv(name, GL_COMPILE_STATUS, &compiled);
		if (compiled != GL_TRUE) {
			GLsizei length = 0;
			char info[2048];
			glGetShaderInfoLog(name, COUNTOF(info), &length, info);
			glDeleteShader(name);

			std::string error_string = info;

			const int context = 3;
			int mod, line, pos;
			if (3 == sscanf(info, "%d:%d(%d)", &mod, &line, &pos)) {
				std::string_view sv(src);
				for (int i = 1; !sv.empty() && i < line + context; ++i) {
					size_t line_end = sv.find("\n");
					int add = 0;

					if (line_end == std::string::npos)
						line_end = sv.size();
					else add = 1;

					if (i >= line - context) {
						error_string += format("\n%d: ", i);
						error_string.append(sv.begin(), sv.begin() + line_end);
					}

					sv.remove_prefix(line_end + add);
				}
			} else {
				//error_string = src;
			}

			return Unexpected(format("Shader compilation error: %s", error_string.c_str()));
		}

		return Shader(name);
	}